

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_mergeAccs(xxh_u64 *acc,xxh_u8 *secret,xxh_u64 start)

{
  XXH64_hash_t XVar1;
  xxh_u8 *in_RDX;
  xxh_u64 *in_RSI;
  size_t i;
  xxh_u64 result64;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    XXH3_mix2Accs(in_RSI,in_RDX);
  }
  XVar1 = XXH3_avalanche(0x14707e);
  return XVar1;
}

Assistant:

static XXH64_hash_t
XXH3_mergeAccs(const xxh_u64* XXH_RESTRICT acc, const xxh_u8* XXH_RESTRICT secret, xxh_u64 start)
{
    xxh_u64 result64 = start;
    size_t i = 0;

    for (i = 0; i < 4; i++) {
        result64 += XXH3_mix2Accs(acc+2*i, secret + 16*i);
#if defined(__clang__)                                /* Clang */ \
    && (defined(__arm__) || defined(__thumb__))       /* ARMv7 */ \
    && (defined(__ARM_NEON) || defined(__ARM_NEON__)) /* NEON */  \
    && !defined(XXH_ENABLE_AUTOVECTORIZE)             /* Define to disable */
        /*
         * UGLY HACK:
         * Prevent autovectorization on Clang ARMv7-a. Exact same problem as
         * the one in XXH3_len_129to240_64b. Speeds up shorter keys > 240b.
         * XXH3_64bits, len == 256, Snapdragon 835:
         *   without hack: 2063.7 MB/s
         *   with hack:    2560.7 MB/s
         */
        XXH_COMPILER_GUARD(result64);
#endif
    }

    return XXH3_avalanche(result64);
}